

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

LoopAnalysis * __thiscall
dxil_spv::CFGStructurizer::analyze_loop
          (LoopAnalysis *__return_storage_ptr__,CFGStructurizer *this,CFGNode *node)

{
  CFGNode *from;
  CFGNode **ppCVar1;
  CFGNode **ppCVar2;
  Vector<CFGNode_*> *this_00;
  bool bVar3;
  LoopExitType LVar4;
  iterator __position;
  pointer ppCVar5;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  _Var6;
  pointer ppCVar7;
  pointer ppCVar8;
  LoopAnalysis *pLVar9;
  _Vector_impl_data *this_01;
  __node_base _Var10;
  CFGNode *loop_exit;
  Vector<CFGNode_*> *__range3;
  LoopAnalysis *local_108;
  CFGNode *local_100;
  LoopAnalysis *local_f8;
  LoopAnalysis *local_f0;
  Vector<CFGNode_*> *__range2;
  LoopBacktracer tracer;
  LoopMergeTracer merge_tracer;
  
  memset(__return_storage_ptr__,0,0x90);
  tracer.traced_blocks._M_h._M_buckets = &tracer.traced_blocks._M_h._M_single_bucket;
  tracer.traced_blocks._M_h._M_bucket_count = 1;
  tracer.traced_blocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  tracer.traced_blocks._M_h._M_element_count = 0;
  tracer.traced_blocks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  tracer.traced_blocks._M_h._M_rehash_policy._M_next_resize = 0;
  tracer.traced_blocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  LoopBacktracer::trace_to_parent(&tracer,node,node->pred_back_edge);
  merge_tracer.loop_exits._M_h._M_buckets = &merge_tracer.loop_exits._M_h._M_single_bucket;
  merge_tracer.loop_exits._M_h._M_bucket_count = 1;
  merge_tracer.loop_exits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  merge_tracer.loop_exits._M_h._M_element_count = 0;
  merge_tracer.loop_exits._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  merge_tracer.loop_exits._M_h._M_rehash_policy._M_next_resize = 0;
  merge_tracer.loop_exits._M_h._M_single_bucket = (__node_base_ptr)0x0;
  merge_tracer.traced_blocks._M_h._M_buckets = &merge_tracer.traced_blocks._M_h._M_single_bucket;
  merge_tracer.traced_blocks._M_h._M_bucket_count = 1;
  merge_tracer.traced_blocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  merge_tracer.traced_blocks._M_h._M_element_count = 0;
  merge_tracer.traced_blocks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  merge_tracer.traced_blocks._M_h._M_rehash_policy._M_next_resize = 0;
  merge_tracer.traced_blocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_100 = node;
  merge_tracer.backtracer = &tracer;
  LoopMergeTracer::trace_from_parent(&merge_tracer,node);
  __range3 = &__return_storage_ptr__->non_dominated_exit;
  local_108 = (LoopAnalysis *)&__return_storage_ptr__->dominated_continue_exit;
  local_f8 = (LoopAnalysis *)&__return_storage_ptr__->inner_dominated_exit;
  __range2 = &__return_storage_ptr__->dominated_exit;
  local_f0 = (LoopAnalysis *)&__return_storage_ptr__->inner_direct_exits;
  for (_Var10 = merge_tracer.loop_exits._M_h._M_before_begin;
      _Var10._M_nxt != (_Hash_node_base *)0x0; _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt) {
    loop_exit = (CFGNode *)_Var10._M_nxt[1]._M_nxt;
    LVar4 = get_loop_exit_type(this,local_100,loop_exit);
    pLVar9 = __return_storage_ptr__;
    switch(LVar4) {
    case Exit:
      break;
    case Merge:
      pLVar9 = (LoopAnalysis *)__range2;
      break;
    case Escape:
      pLVar9 = (LoopAnalysis *)__range3;
      break;
    case MergeToInfiniteLoop:
      pLVar9 = local_108;
      break;
    case InnerLoopExit:
      pLVar9 = local_f0;
      break;
    case InnerLoopMerge:
      pLVar9 = local_f8;
      break;
    default:
      goto switchD_001296d4_default;
    }
    std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
    push_back(&pLVar9->direct_exits,&loop_exit);
switchD_001296d4_default:
  }
  __position._M_current =
       (__return_storage_ptr__->dominated_continue_exit).
       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
LAB_00129708:
  this_00 = __range2;
  pLVar9 = local_108;
  if (__position._M_current ==
      (__return_storage_ptr__->dominated_continue_exit).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    if (8 < (ulong)((long)__position._M_current -
                   (long)(local_108->direct_exits).
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
      loop_exit = find_common_post_dominator(&local_108->direct_exits);
      if ((loop_exit == (CFGNode *)0x0) || (bVar3 = CFGNode::dominates(local_100,loop_exit), !bVar3)
         ) {
        std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
        insert<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,void>
                  ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>> *)
                   __range3,(const_iterator)
                            (__return_storage_ptr__->non_dominated_exit).
                            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                    )(__return_storage_ptr__->dominated_continue_exit).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                    )(__return_storage_ptr__->dominated_continue_exit).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        ppCVar7 = (__return_storage_ptr__->dominated_continue_exit).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((__return_storage_ptr__->dominated_continue_exit).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppCVar7) {
          (__return_storage_ptr__->dominated_continue_exit).
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppCVar7;
        }
      }
      else {
        ppCVar7 = (__return_storage_ptr__->dominated_continue_exit).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((__return_storage_ptr__->dominated_continue_exit).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppCVar7) {
          (__return_storage_ptr__->dominated_continue_exit).
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppCVar7;
        }
        std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
        push_back(&pLVar9->direct_exits,&loop_exit);
      }
    }
    if (((__return_storage_ptr__->dominated_exit).
         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (__return_storage_ptr__->dominated_exit).
         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((__return_storage_ptr__->inner_dominated_exit).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (__return_storage_ptr__->inner_dominated_exit).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      std::_Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
      _Vector_impl_data::_M_swap_data((_Vector_impl_data *)this_00,(_Vector_impl_data *)local_f8);
    }
    ppCVar5 = (__return_storage_ptr__->direct_exits).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppCVar7 = (__return_storage_ptr__->direct_exits).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar5 == ppCVar7) {
      std::_Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
      _Vector_impl_data::_M_swap_data
                ((_Vector_impl_data *)__return_storage_ptr__,(_Vector_impl_data *)local_f0);
      ppCVar5 = (__return_storage_ptr__->direct_exits).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar7 = (__return_storage_ptr__->direct_exits).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    ppCVar8 = ppCVar7;
    if (((__return_storage_ptr__->dominated_exit).
         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (__return_storage_ptr__->dominated_exit).
         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) && (ppCVar8 = ppCVar5, ppCVar5 != ppCVar7)) {
      std::_Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
      _Vector_impl_data::_M_swap_data
                ((_Vector_impl_data *)this_00,(_Vector_impl_data *)__return_storage_ptr__);
      ppCVar5 = (__return_storage_ptr__->direct_exits).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar8 = (__return_storage_ptr__->direct_exits).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    if ((((long)ppCVar8 - (long)ppCVar5 == 8) &&
        ((__return_storage_ptr__->dominated_exit).
         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (__return_storage_ptr__->dominated_exit).
         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish)) &&
       ((__return_storage_ptr__->non_dominated_exit).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->non_dominated_exit).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      bVar3 = CFGNode::dominates(local_100,*ppCVar5);
      this_01 = (_Vector_impl_data *)__range3;
      if (bVar3) {
        this_01 = (_Vector_impl_data *)this_00;
      }
      std::_Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
      _Vector_impl_data::_M_swap_data(this_01,(_Vector_impl_data *)__return_storage_ptr__);
    }
    if (8 < (ulong)((long)(__return_storage_ptr__->dominated_exit).
                          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(__return_storage_ptr__->dominated_exit).
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
      loop_exit = find_common_post_dominator(this_00);
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode*const>>
                        ((__return_storage_ptr__->dominated_exit).
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (__return_storage_ptr__->dominated_exit).
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      ppCVar1 = (__return_storage_ptr__->dominated_exit).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (_Var6._M_current != ppCVar1) {
        ppCVar2 = (this_00->
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (ppCVar1 != ppCVar2) {
          (__return_storage_ptr__->dominated_exit).
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppCVar2;
        }
        std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
        push_back(this_00,&loop_exit);
      }
    }
    LoopMergeTracer::~LoopMergeTracer(&merge_tracer);
    std::
    _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&tracer);
    return __return_storage_ptr__;
  }
  from = *__position._M_current;
  ppCVar7 = (__return_storage_ptr__->dominated_exit).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar5 = (__return_storage_ptr__->dominated_exit).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  loop_exit = from;
  do {
    if (ppCVar7 == ppCVar5) {
      ppCVar7 = (__return_storage_ptr__->non_dominated_exit).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar5 = (__return_storage_ptr__->non_dominated_exit).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_00129747;
    }
    bVar3 = query_reachability(this,from,*ppCVar7);
    ppCVar7 = ppCVar7 + 1;
  } while (!bVar3);
  goto LAB_00129763;
  while( true ) {
    bVar3 = query_reachability(this,from,*ppCVar7);
    ppCVar7 = ppCVar7 + 1;
    if (bVar3) break;
LAB_00129747:
    if (ppCVar7 == ppCVar5) {
      __position._M_current = __position._M_current + 1;
      goto LAB_00129708;
    }
  }
LAB_00129763:
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::push_back
            (__range3,&loop_exit);
  __position = std::
               vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
               erase(&local_108->direct_exits,__position._M_current);
  goto LAB_00129708;
}

Assistant:

CFGStructurizer::LoopAnalysis CFGStructurizer::analyze_loop(CFGNode *node) const
{
	LoopAnalysis result;

	// Now, we need to figure out which blocks belong in the loop construct.
	// The way to figure out a natural loop is any block which is dominated by loop header
	// and control flow passes to one of the back edges.

	// Unfortunately, it can be ambiguous which block is the merge block for a loop.
	// Ideally, there is a unique block which is the loop exit block, but if there are multiple breaks
	// there are multiple blocks which are not part of the loop construct.

	LoopBacktracer tracer;
	auto *pred = node->pred_back_edge;

	// Back-trace from here.
	// The CFG is reducible, so node must dominate pred.
	// Since node dominates pred, there is no pred chain we can follow without
	// eventually hitting node, and we'll stop traversal there.

	// All nodes which are touched during this traversal must be part of the loop construct.
	tracer.trace_to_parent(node, pred);

	LoopMergeTracer merge_tracer(tracer);
	merge_tracer.trace_from_parent(node);

	for (auto *loop_exit : merge_tracer.loop_exits)
	{
		auto exit_type = get_loop_exit_type(*node, *loop_exit);
		switch (exit_type)
		{
		case LoopExitType::Exit:
			result.direct_exits.push_back(loop_exit);
			break;

		case LoopExitType::InnerLoopExit:
			// It's not an exit for us, but the inner loop.
			result.inner_direct_exits.push_back(loop_exit);
			break;

		case LoopExitType::Merge:
			result.dominated_exit.push_back(loop_exit);
			break;

		case LoopExitType::InnerLoopMerge:
			result.inner_dominated_exit.push_back(loop_exit);
			break;

		case LoopExitType::InnerLoopFalsePositive:
			// In this case, the inner loop can only exit at the loop header,
			// and thus post-dominance analysis will always fail.
			// Ignore this case as it's a false exit.
			break;

		case LoopExitType::Escape:
			result.non_dominated_exit.push_back(loop_exit);
			break;

		case LoopExitType::MergeToInfiniteLoop:
			result.dominated_continue_exit.push_back(loop_exit);
			break;
		}
	}

	// A dominated continue exit should not be considered as such if it can reach other "normal" exits.
	// In this case, it's just a break.
	auto continue_itr = result.dominated_continue_exit.begin();
	while (continue_itr != result.dominated_continue_exit.end())
	{
		auto *candidate = *continue_itr;
		bool found_candidate = false;
		for (auto *dominated : result.dominated_exit)
		{
			if (query_reachability(*candidate, *dominated))
			{
				result.non_dominated_exit.push_back(candidate);
				continue_itr = result.dominated_continue_exit.erase(continue_itr);
				found_candidate = true;
				break;
			}
		}

		if (!found_candidate)
		{
			for (auto *non_dominated : result.non_dominated_exit)
			{
				if (query_reachability(*candidate, *non_dominated))
				{
					result.non_dominated_exit.push_back(candidate);
					continue_itr = result.dominated_continue_exit.erase(continue_itr);
					found_candidate = true;
					break;
				}
			}
		}

		if (!found_candidate)
			++continue_itr;
	}

	if (result.dominated_continue_exit.size() > 1)
	{
		// If we have multiple continue exit candidates, they better merge into a single clean candidate that we
		// still dominate, otherwise, ignore this case and treat them all as normal Escape nodes.
		auto *common = find_common_post_dominator(result.dominated_continue_exit);
		if (common && node->dominates(common))
		{
			result.dominated_continue_exit.clear();
			result.dominated_continue_exit.push_back(common);
		}
		else
		{
			result.non_dominated_exit.insert(result.non_dominated_exit.end(),
			                                 result.dominated_continue_exit.begin(),
			                                 result.dominated_continue_exit.end());
			result.dominated_continue_exit.clear();
		}
	}

	// If the only merge candidates we have are inner dominated, treat them as true dominated exits.
	if (result.dominated_exit.empty() && !result.inner_dominated_exit.empty())
		std::swap(result.dominated_exit, result.inner_dominated_exit);

	// If there are no direct exists, treat inner direct exists as direct exits.
	if (result.direct_exits.empty())
		std::swap(result.direct_exits, result.inner_direct_exits);

	// A direct exit can be considered a dominated exit if there are no better candidates.
	if (result.dominated_exit.empty() && !result.direct_exits.empty())
		std::swap(result.dominated_exit, result.direct_exits);

	// If we only have one direct exit, consider it our merge block.
	// Pick either Merge or Escape.
	if (result.direct_exits.size() == 1 && result.dominated_exit.empty() && result.non_dominated_exit.empty())
	{
		if (node->dominates(result.direct_exits.front()))
			std::swap(result.dominated_exit, result.direct_exits);
		else
			std::swap(result.non_dominated_exit, result.direct_exits);
	}

	if (result.dominated_exit.size() >= 2)
	{
		// Try to see if we can reduce the number of merge blocks to just 1.
		// This is relevant if we have various "clean" break blocks.
		auto *post_dominator = find_common_post_dominator(result.dominated_exit);
		if (std::find(result.dominated_exit.begin(), result.dominated_exit.end(),
		              post_dominator) != result.dominated_exit.end())
		{
			result.dominated_exit.clear();
			result.dominated_exit.push_back(post_dominator);
		}
	}

	return result;
}